

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::Instruction::GetBaseAddress(Instruction *this)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *this_01;
  uint uVar1;
  
  id = GetSingleWordInOperand(this,0);
  while( true ) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    this_01 = analysis::DefUseManager::GetDef(this_00,id);
    uVar1 = this_01->opcode_ - OpImageTexelPointer;
    if ((0x17 < uVar1) || ((0x8004e1U >> (uVar1 & 0x1f) & 1) == 0)) break;
    id = GetSingleWordInOperand(this_01,0);
  }
  return this_01;
}

Assistant:

Instruction* Instruction::GetBaseAddress() const {
  uint32_t base = GetSingleWordInOperand(kLoadBaseIndex);
  Instruction* base_inst = context()->get_def_use_mgr()->GetDef(base);
  bool done = false;
  while (!done) {
    switch (base_inst->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpPtrAccessChain:
      case spv::Op::OpInBoundsPtrAccessChain:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpCopyObject:
        // All of these instructions have the base pointer use a base pointer
        // in in-operand 0.
        base = base_inst->GetSingleWordInOperand(0);
        base_inst = context()->get_def_use_mgr()->GetDef(base);
        break;
      default:
        done = true;
        break;
    }
  }
  return base_inst;
}